

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::blitStencilToColor2DArray
               (RenderContext *renderCtx,deUint32 srcTex,int width,int height,int level)

{
  void **__return_storage_ptr__;
  code *pcVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 uVar6;
  ProgramSources *pPVar7;
  undefined4 extraout_var;
  TestError *this;
  VertexArrayBinding *local_4c8;
  PrimitiveList local_408;
  undefined1 local_3ea;
  allocator<char> local_3e9;
  string local_3e8;
  long local_3c8;
  Functions *gl;
  deUint8 indices [6];
  allocator<char> local_391;
  string local_390;
  void **local_370;
  undefined1 local_368 [8];
  VertexArrayBinding vertexArrays [2];
  float texCoord [12];
  float positions [8];
  allocator<char> local_269;
  string local_268;
  ShaderSource local_248;
  allocator<char> local_209;
  string local_208;
  ShaderSource local_1e8;
  ProgramSources local_1c0;
  undefined1 local_f0 [8];
  ShaderProgram program;
  int level_local;
  int height_local;
  int width_local;
  deUint32 srcTex_local;
  RenderContext *renderCtx_local;
  
  program.m_program.m_info.linkTimeUs._0_4_ = level;
  program.m_program.m_info.linkTimeUs._4_4_ = height;
  glu::ProgramSources::ProgramSources(&local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec3 a_texCoord;\nout highp vec3 v_texCoord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_texCoord = a_texCoord;\n}\n"
             ,&local_209);
  glu::VertexSource::VertexSource((VertexSource *)&local_1e8,&local_208);
  pPVar7 = glu::ProgramSources::operator<<(&local_1c0,&local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,
             "#version 300 es\nuniform highp usampler2DArray u_sampler;\nin highp vec3 v_texCoord;\nlayout(location = 0) out highp uint o_stencil;\nvoid main (void)\n{\n\to_stencil = texture(u_sampler, v_texCoord).x;\n}\n"
             ,&local_269);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_248,&local_268);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_248);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_f0,renderCtx,pPVar7);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  glu::ProgramSources::~ProgramSources(&local_1c0);
  texCoord[10] = -1.0;
  texCoord[0xb] = -1.0;
  vertexArrays[1].pointer.data._0_4_ = 0;
  vertexArrays[1].pointer.data._4_4_ = 0;
  texCoord[0] = (float)(int)program.m_program.m_info.linkTimeUs;
  texCoord[1] = 1.0;
  texCoord[2] = 0.0;
  texCoord[3] = (float)(int)program.m_program.m_info.linkTimeUs;
  texCoord[4] = 0.0;
  texCoord[5] = 1.0;
  texCoord[6] = (float)(int)program.m_program.m_info.linkTimeUs;
  texCoord[7] = 1.0;
  texCoord[8] = 1.0;
  texCoord[9] = (float)(int)program.m_program.m_info.linkTimeUs;
  gl._6_1_ = 1;
  local_370 = (void **)local_368;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"a_position",&local_391);
  glu::va::Float((VertexArrayBinding *)local_368,&local_390,2,4,0,texCoord + 10);
  __return_storage_ptr__ = &vertexArrays[0].pointer.data;
  local_370 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)indices,"a_texCoord",(allocator<char> *)((long)&gl + 7));
  glu::va::Float((VertexArrayBinding *)__return_storage_ptr__,(string *)indices,3,4,0,
                 (float *)&vertexArrays[1].pointer.data);
  gl._6_1_ = 0;
  std::__cxx11::string::~string((string *)indices);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gl + 7));
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  gl._4_2_ = 0x301;
  gl._0_4_ = 0x2020100;
  iVar4 = (*renderCtx->_vptr_RenderContext[3])();
  local_3c8 = CONCAT44(extraout_var,iVar4);
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_f0);
  if (!bVar3) {
    local_3ea = 1;
    this = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"Compile failed",&local_3e9);
    tcu::TestError::TestError(this,&local_3e8);
    local_3ea = 0;
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(local_3c8 + 8))(0x84c0);
  (**(code **)(local_3c8 + 0xb8))(0x8c1a,srcTex);
  (**(code **)(local_3c8 + 0x1360))(0x8c1a,0x2801,0x2600);
  (**(code **)(local_3c8 + 0x1360))(0x8c1a,0x2800,0x2600);
  (**(code **)(local_3c8 + 0x1360))(0x8c1a,0x90ea,0x1901);
  dVar5 = (**(code **)(local_3c8 + 0x800))();
  glu::checkError(dVar5,"Texture state setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x13e);
  pcVar1 = *(code **)(local_3c8 + 0x1680);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f0);
  (*pcVar1)(dVar5);
  pcVar1 = *(code **)(local_3c8 + 0x14f0);
  pcVar2 = *(code **)(local_3c8 + 0xb48);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f0);
  uVar6 = (*pcVar2)(dVar5,"u_sampler");
  (*pcVar1)(uVar6,0);
  dVar5 = (**(code **)(local_3c8 + 0x800))();
  glu::checkError(dVar5,"Program setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x142);
  (**(code **)(local_3c8 + 0x1a00))(0,0,width,program.m_program.m_info.linkTimeUs._4_4_);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f0);
  glu::pr::Triangles(&local_408,6,(deUint8 *)&gl);
  glu::draw(renderCtx,dVar5,2,(VertexArrayBinding *)local_368,&local_408,(DrawUtilCallback *)0x0);
  local_4c8 = (VertexArrayBinding *)&vertexArrays[1].pointer.data;
  do {
    local_4c8 = local_4c8 + -1;
    glu::VertexArrayBinding::~VertexArrayBinding(local_4c8);
  } while (local_4c8 != (VertexArrayBinding *)local_368);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_f0);
  return;
}

Assistant:

static void blitStencilToColor2DArray (const glu::RenderContext& renderCtx, deUint32 srcTex, int width, int height, int level)
{
	const glu::ShaderProgram program(renderCtx, glu::ProgramSources()
		<< glu::VertexSource(
			"#version 300 es\n"
			"in highp vec4 a_position;\n"
			"in highp vec3 a_texCoord;\n"
			"out highp vec3 v_texCoord;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"	v_texCoord = a_texCoord;\n"
			"}\n")
		<< glu::FragmentSource(
			"#version 300 es\n"
			"uniform highp usampler2DArray u_sampler;\n"
			"in highp vec3 v_texCoord;\n"
			"layout(location = 0) out highp uint o_stencil;\n"
			"void main (void)\n"
			"{\n"
			"	o_stencil = texture(u_sampler, v_texCoord).x;\n"
			"}\n"));

	const float positions[] =
	{
		-1.0f, -1.0f,
		+1.0f, -1.0f,
		-1.0f, +1.0f,
		+1.0f, +1.0f
	};
	const float texCoord[] =
	{
		0.0f, 0.0f, float(level),
		1.0f, 0.0f, float(level),
		0.0f, 1.0f, float(level),
		1.0f, 1.0f, float(level)
	};
	const glu::VertexArrayBinding vertexArrays[] =
	{
		glu::va::Float("a_position", 2, 4, 0, &positions[0]),
		glu::va::Float("a_texCoord", 3, 4, 0, &texCoord[0])
	};
	const deUint8 indices[] = { 0, 1, 2, 2, 1, 3 };

	const glw::Functions& gl = renderCtx.getFunctions();

	if (!program.isOk())
		throw tcu::TestError("Compile failed");

	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, srcTex);
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_DEPTH_STENCIL_TEXTURE_MODE, GL_STENCIL_INDEX);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture state setup failed");

	gl.useProgram(program.getProgram());
	gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_sampler"), 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program setup failed");

	gl.viewport(0, 0, width, height);
	glu::draw(renderCtx, program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
			  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
}